

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O3

void Oprops_on(obj *otmp,uint mask)

{
  byte *pbVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  
  uVar2 = otmp->oprops;
  if ((uVar2 & 1) != 0) {
    u.uprops[1].extrinsic = u.uprops[1].extrinsic | mask;
  }
  if ((uVar2 & 2) != 0) {
    u.uprops[2].extrinsic = u.uprops[2].extrinsic | mask;
  }
  if ((uVar2 & 4) != 0) {
    u.uprops[0x35].extrinsic = u.uprops[0x35].extrinsic | mask;
  }
  if ((uVar2 & 0x20) != 0) {
    uVar5 = u.uprops[0x1a].extrinsic | mask;
    bVar3 = u.uprops[0x1a].extrinsic == 0;
    u.uprops[0x1a].extrinsic = uVar5;
    if ((u.uprops[0x1a].intrinsic & 0xffffff) == 0 && bVar3) {
      *(byte *)&otmp->oprops_known = (byte)otmp->oprops_known | 0x20;
      pcVar6 = " a bit more";
      if (u.uprops[0x1a].intrinsic == 0) {
        pcVar6 = "";
      }
      pline("You feel yourself speed up%s.",pcVar6);
    }
  }
  if ((uVar2 & 0x10) != 0) {
    u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic | mask;
  }
  if ((uVar2 & 0x40) != 0) {
    pcVar6 = Tobjnam(otmp,"fit");
    pline("%s very tightly.",pcVar6);
    *(byte *)&otmp->oprops_known = (byte)otmp->oprops_known | 0x40;
  }
  if ((char)uVar2 < '\0') {
    *(byte *)&otmp->oprops_known = (byte)otmp->oprops_known | 0x80;
  }
  uVar5 = (uint)uVar2;
  if ((uVar2 & 0x300) != 0) {
    adj_abon(otmp,otmp->spe);
  }
  if ((uVar5 >> 10 & 1) != 0) {
    u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic | mask;
    see_monsters();
  }
  if ((uVar5 >> 0xb & 1) != 0) {
    u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic | mask;
    pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((uVar5 >> 0xc & 1) != 0) {
    u.uprops[0xb].extrinsic = u.uprops[0xb].extrinsic | mask;
  }
  if ((uVar5 >> 0xd & 1) != 0) {
    u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | mask;
    see_monsters();
  }
  if ((uVar5 >> 0xe & 1) != 0) {
    if (((u.uprops[0x13].extrinsic == 0) && (u.uprops[0x13].intrinsic == 0)) &&
       (u.uprops[0x13].blocked == 0)) {
      pline("You move very quietly.");
      pbVar1 = (byte *)((long)&otmp->oprops_known + 1);
      *pbVar1 = *pbVar1 | 0x40;
    }
    u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic | mask;
  }
  if ((short)uVar2 < 0) {
    if ((u.uprops[0x25].extrinsic == 0) && (u.uprops[0x25].intrinsic < 0x1000000)) {
      uVar4 = mt_random();
      incr_itimeout(&u.uprops[0x25].intrinsic,(ulong)(uVar4 % 0x14 + 1));
    }
    u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic | mask;
  }
  if ((uVar5 >> 0x10 & 1) != 0) {
    u.uprops[0x2e].extrinsic = u.uprops[0x2e].extrinsic | mask;
  }
  if ((uVar5 >> 0x12 & 1) != 0) {
    u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic | mask;
  }
  if ((uVar5 >> 0x13 & 1) != 0) {
    u.uprops[0x14].extrinsic = u.uprops[0x14].extrinsic | mask;
  }
  return;
}

Assistant:

static void Oprops_on(struct obj *otmp, unsigned int mask)
{
	long props = otmp->oprops;

	if (props & ITEM_FIRE)
	    EFire_resistance |= mask;

	if (props & ITEM_FROST)
	    ECold_resistance |= mask;

	if (props & ITEM_DRLI)
	    EDrain_resistance |= mask;

	if (props & ITEM_SPEED) {
	    boolean old = !!EFast;
	    EFast |= mask;
	    if (!(HFast & TIMEOUT) && !old) {
		otmp->oprops_known |= ITEM_SPEED;
		pline("You feel yourself speed up%s.",
		      (old || HFast) ? " a bit more" : "");
	    }
	}

	if (props & ITEM_REFLECTION)
	    EReflecting |= mask;

	if (props & ITEM_OILSKIN) {
	    pline("%s very tightly.", Tobjnam(otmp, "fit"));
	    otmp->oprops_known |= ITEM_OILSKIN;
	}

	if (props & ITEM_POWER)
	    otmp->oprops_known |= ITEM_POWER;

	if (props & (ITEM_DEXTERITY|ITEM_BRILLIANCE))
	    adj_abon(otmp, otmp->spe);

	if (props & ITEM_ESP) {
	    ETelepat |= mask;
	    see_monsters();
	}

	if (props & ITEM_DISPLACEMENT) {
	    EDisplaced |= mask;
	    otmp->oprops_known |= ITEM_DISPLACEMENT;
	}

	if (props & ITEM_SEARCHING)
	    ESearching |= mask;

	if (props & ITEM_WARNING) {
	    EWarning |= mask;
	    see_monsters();
	}

	if (props & ITEM_STEALTH) {
	    if (!EStealth && !HStealth && !BStealth) {
		pline("You move very quietly.");
		otmp->oprops_known |= ITEM_STEALTH;
	    }
	    EStealth |= mask;
	}

	if (props & ITEM_FUMBLING) {
	    if (!EFumbling && !(HFumbling & ~TIMEOUT))
		incr_itimeout(&HFumbling, rnd(20));
	    EFumbling |= mask;
	}

	if (props & ITEM_CLAIRVOYANCE)
	    EClairvoyant |= mask;

	if (props & ITEM_HUNGER)
	    EHunger |= mask;

	if (props & ITEM_AGGRAVATE)
	    EAggravate_monster |= mask;
}